

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-basic.c
# Opt level: O0

hd_stream * hd_open_concat(hd_context *ctx,int len,int pad)

{
  int *state_00;
  hd_stream *phVar1;
  concat_filter *state;
  int pad_local;
  int len_local;
  hd_context *ctx_local;
  
  state_00 = (int *)hd_calloc(ctx,1,(long)(len + -1) * 8 + 0x20);
  *state_00 = len;
  state_00[1] = 0;
  state_00[2] = 0;
  state_00[3] = pad;
  *(undefined1 *)(state_00 + 4) = 0x20;
  phVar1 = hd_new_stream(ctx,state_00,next_concat,close_concat);
  return phVar1;
}

Assistant:

hd_stream *
hd_open_concat(hd_context *ctx, int len, int pad)
{
    struct concat_filter *state;

    state = hd_calloc(ctx, 1, sizeof(struct concat_filter) + (len-1)*sizeof(hd_stream *));
    state->max = len;
    state->count = 0;
    state->current = 0;
    state->pad = pad;
    state->ws_buf = 32;

    return hd_new_stream(ctx, state, next_concat, close_concat);
}